

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O0

Aig_Man_t * Rtm_ManRetime(Aig_Man_t *p,int fForward,int nStepsMax,int fVerbose)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  abctime aVar5;
  Rtm_Man_t *p_00;
  void *pvVar6;
  Rtm_Edg_t *pEdge;
  abctime aVar7;
  Vec_Ptr_t *p_01;
  Rtm_Obj_t *pObj_00;
  Rtm_Obj_t *pRVar8;
  char *pcVar9;
  Aig_Man_t *pAVar10;
  Rtm_Init_t Val;
  abctime clk;
  int DegreeMax;
  int Degree;
  int nAutos;
  int k;
  int i;
  Aig_Obj_t *pObjAig;
  Rtm_Obj_t *pNext;
  Rtm_Obj_t *pObj;
  Rtm_Man_t *pRtm;
  Aig_Man_t *pNew;
  Vec_Ptr_t *vQueue;
  int fVerbose_local;
  int nStepsMax_local;
  int fForward_local;
  Aig_Man_t *p_local;
  
  aVar5 = Abc_Clock();
  p_00 = Rtm_ManFromAig(p);
  iVar1 = Aig_ManCiNum(p);
  iVar2 = Aig_ManRegNum(p);
  for (nAutos = iVar1 - iVar2; iVar1 = Vec_PtrSize(p->vCis), nAutos < iVar1; nAutos = nAutos + 1) {
    pvVar6 = Vec_PtrEntry(p->vCis,nAutos);
    pEdge = Rtm_ObjEdge(*(Rtm_Obj_t **)((long)pvVar6 + 0x28),0);
    Val = RTM_VAL_VOID;
    if (fForward != 0) {
      Val = RTM_VAL_ZERO;
    }
    Rtm_ObjAddFirst(p_00,pEdge,Val);
  }
  if (fForward == 0) {
    DegreeMax = Rtm_ManMarkAutoBwd(p_00);
  }
  else {
    DegreeMax = Rtm_ManMarkAutoFwd(p_00);
  }
  if (fVerbose != 0) {
    printf("Detected %d autonomous objects. ",(ulong)(uint)DegreeMax);
    Abc_Print(1,"%s =","Time");
    aVar7 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar7 - aVar5) * 1.0) / 1000000.0);
  }
  nAutos = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(p_00->vObjs);
    if (iVar1 <= nAutos) {
      aVar5 = Abc_Clock();
      p_01 = Vec_PtrAlloc(1000);
      if (fForward == 0) {
        iVar1 = Aig_ManCoNum(p);
        iVar2 = Aig_ManRegNum(p);
        for (nAutos = iVar1 - iVar2; iVar1 = Vec_PtrSize(p->vCos), nAutos < iVar1;
            nAutos = nAutos + 1) {
          pvVar6 = Vec_PtrEntry(p->vCos,nAutos);
          pvVar6 = *(void **)((long)pvVar6 + 0x28);
          if ((*(uint *)((long)pvVar6 + 8) >> 4 & 1) == 0) {
            *(uint *)((long)pvVar6 + 8) = *(uint *)((long)pvVar6 + 8) & 0xfffffff7 | 8;
            Vec_PtrPush(p_01,pvVar6);
          }
        }
      }
      else {
        iVar1 = Aig_ManCiNum(p);
        iVar2 = Aig_ManRegNum(p);
        for (nAutos = iVar1 - iVar2; iVar1 = Vec_PtrSize(p->vCis), nAutos < iVar1;
            nAutos = nAutos + 1) {
          pvVar6 = Vec_PtrEntry(p->vCis,nAutos);
          pvVar6 = *(void **)((long)pvVar6 + 0x28);
          if ((*(uint *)((long)pvVar6 + 8) >> 4 & 1) == 0) {
            *(uint *)((long)pvVar6 + 8) = *(uint *)((long)pvVar6 + 8) & 0xfffffff7 | 8;
            Vec_PtrPush(p_01,pvVar6);
          }
        }
      }
      clk._4_4_ = 0;
      for (nAutos = 0; iVar1 = Vec_PtrSize(p_01), nAutos < iVar1; nAutos = nAutos + 1) {
        pObj_00 = (Rtm_Obj_t *)Vec_PtrEntry(p_01,nAutos);
        *(uint *)&pObj_00->field_0x8 = *(uint *)&pObj_00->field_0x8 & 0xfffffff7;
        if (fForward == 0) {
          Rtm_ObjRetimeBwd(p_00,pObj_00);
          for (Degree = 0; Degree < (int)(*(uint *)&pObj_00->field_0x8 >> 7 & 0xff);
              Degree = Degree + 1) {
            pRVar8 = Rtm_ObjFanin(pObj_00,Degree);
            if ((((*(uint *)&pRVar8->field_0x8 >> 3 & 1) == 0) &&
                ((*(uint *)&pRVar8->field_0x8 >> 7 & 0xff) != 0)) &&
               (iVar1 = Rtm_ObjCheckRetimeBwd(pRVar8), iVar1 != 0)) {
              iVar1 = Rtm_ObjGetDegreeBwd(pRVar8);
              clk._4_4_ = Abc_MaxInt(clk._4_4_,iVar1);
              if (iVar1 <= nStepsMax) {
                *(uint *)&pRVar8->field_0x8 = *(uint *)&pRVar8->field_0x8 & 0xfffffff7 | 8;
                *(uint *)&pRVar8->field_0x8 = *(uint *)&pRVar8->field_0x8 & 0x7fff | iVar1 << 0xf;
                Vec_PtrPush(p_01,pRVar8);
              }
            }
          }
        }
        else {
          Rtm_ObjRetimeFwd(p_00,pObj_00);
          for (Degree = 0; Degree < pObj_00->nFanouts; Degree = Degree + 1) {
            pRVar8 = Rtm_ObjFanout(pObj_00,Degree);
            if ((((*(uint *)&pRVar8->field_0x8 >> 3 & 1) == 0) &&
                ((*(uint *)&pRVar8->field_0x8 & 7) == 0)) &&
               (iVar1 = Rtm_ObjCheckRetimeFwd(pRVar8), iVar1 != 0)) {
              iVar1 = Rtm_ObjGetDegreeFwd(pRVar8);
              clk._4_4_ = Abc_MaxInt(clk._4_4_,iVar1);
              if (iVar1 <= nStepsMax) {
                *(uint *)&pRVar8->field_0x8 = *(uint *)&pRVar8->field_0x8 & 0xfffffff7 | 8;
                *(uint *)&pRVar8->field_0x8 = *(uint *)&pRVar8->field_0x8 & 0x7fff | iVar1 << 0xf;
                Vec_PtrPush(p_01,pRVar8);
              }
            }
          }
        }
      }
      if (fVerbose != 0) {
        uVar3 = Vec_PtrSize(p_01);
        pcVar9 = "bwd";
        if (fForward != 0) {
          pcVar9 = "fwd";
        }
        uVar4 = Rtm_ManLatchMax(p_00);
        printf("Performed %d %s latch moves of max depth %d and max latch count %d.\n",(ulong)uVar3,
               pcVar9,(ulong)clk._4_4_,(ulong)uVar4);
        printf("Memory usage = %d.  ",(ulong)(uint)p_00->nExtraCur);
        Abc_Print(1,"%s =","Time");
        aVar7 = Abc_Clock();
        Abc_Print(1,"%9.2f sec\n",((double)(aVar7 - aVar5) * 1.0) / 1000000.0);
      }
      Vec_PtrFree(p_01);
      pAVar10 = Rtm_ManToAig(p_00);
      pcVar9 = Abc_UtilStrsav(p->pName);
      pAVar10->pName = pcVar9;
      pcVar9 = Abc_UtilStrsav(p->pSpec);
      pAVar10->pSpec = pcVar9;
      Rtm_ManFree(p_00);
      aVar5 = Abc_Clock();
      pAVar10 = Aig_ManReduceLaches(pAVar10,fVerbose);
      if (fVerbose != 0) {
        Abc_Print(1,"%s =","Register sharing time");
        aVar7 = Abc_Clock();
        Abc_Print(1,"%9.2f sec\n",((double)(aVar7 - aVar5) * 1.0) / 1000000.0);
      }
      return pAVar10;
    }
    pvVar6 = Vec_PtrEntry(p_00->vObjs,nAutos);
    if ((*(uint *)((long)pvVar6 + 8) >> 7 & 0xff) != *(uint *)((long)pvVar6 + 8) >> 0xf) break;
    if (*(int *)((long)pvVar6 + 0x14) != *(int *)((long)pvVar6 + 0x10)) {
      __assert_fail("pObj->nFanouts == pObj->Temp",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigRet.c"
                    ,0x361,"Aig_Man_t *Rtm_ManRetime(Aig_Man_t *, int, int, int)");
    }
    *(uint *)((long)pvVar6 + 8) = *(uint *)((long)pvVar6 + 8) & 0x7fff;
    nAutos = nAutos + 1;
  }
  __assert_fail("pObj->nFanins == pObj->Num",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigRet.c"
                ,0x360,"Aig_Man_t *Rtm_ManRetime(Aig_Man_t *, int, int, int)");
}

Assistant:

Aig_Man_t * Rtm_ManRetime( Aig_Man_t * p, int fForward, int nStepsMax, int fVerbose )
{
    Vec_Ptr_t * vQueue;
    Aig_Man_t * pNew;
    Rtm_Man_t * pRtm;
    Rtm_Obj_t * pObj, * pNext;
    Aig_Obj_t * pObjAig;
    int i, k, nAutos, Degree, DegreeMax = 0; 
    abctime clk;

    // create the retiming manager
clk = Abc_Clock();
    pRtm = Rtm_ManFromAig( p );
    // set registers
    Aig_ManForEachLoSeq( p, pObjAig, i )
        Rtm_ObjAddFirst( pRtm, Rtm_ObjEdge((Rtm_Obj_t *)pObjAig->pData, 0), fForward? RTM_VAL_ZERO : RTM_VAL_VOID );
    // detect and mark the autonomous components
    if ( fForward )
        nAutos = Rtm_ManMarkAutoFwd( pRtm );
    else
        nAutos = Rtm_ManMarkAutoBwd( pRtm );
    if ( fVerbose )
    {
        printf( "Detected %d autonomous objects. ", nAutos );
        ABC_PRT( "Time", Abc_Clock() - clk );
    }

    // set the current retiming number
    Rtm_ManForEachObj( pRtm, pObj, i )
    {
        assert( pObj->nFanins == pObj->Num );
        assert( pObj->nFanouts == pObj->Temp );
        pObj->Num = 0;
    }

clk = Abc_Clock();
    // put the LOs on the queue
    vQueue = Vec_PtrAlloc( 1000 );
    if ( fForward )
    {
        Aig_ManForEachLoSeq( p, pObjAig, i )
        {
            pObj = (Rtm_Obj_t *)pObjAig->pData;
            if ( pObj->fAuto )
                continue;
            pObj->fMark = 1;
            Vec_PtrPush( vQueue, pObj );
        }
    }
    else
    {
        Aig_ManForEachLiSeq( p, pObjAig, i )
        {
            pObj = (Rtm_Obj_t *)pObjAig->pData;
            if ( pObj->fAuto )
                continue;
            pObj->fMark = 1;
            Vec_PtrPush( vQueue, pObj );
        }
    }
    // perform retiming 
    DegreeMax = 0;
    Vec_PtrForEachEntry( Rtm_Obj_t *, vQueue, pObj, i )
    {
        pObj->fMark = 0;
        // retime the node 
        if ( fForward )
        {
            Rtm_ObjRetimeFwd( pRtm, pObj );
            // check if its fanouts should be retimed
            Rtm_ObjForEachFanout( pObj, pNext, k )
            {
                if ( pNext->fMark ) // skip aleady scheduled
                    continue;
                if ( pNext->Type ) // skip POs
                    continue;
                if ( !Rtm_ObjCheckRetimeFwd( pNext ) ) // skip non-retimable
                    continue;
                Degree = Rtm_ObjGetDegreeFwd( pNext );
                DegreeMax = Abc_MaxInt( DegreeMax, Degree );
                if ( Degree > nStepsMax ) // skip nodes with high degree
                    continue;
                pNext->fMark = 1;
                pNext->Num = Degree;
                Vec_PtrPush( vQueue, pNext );
            }
        }
        else
        {
            Rtm_ObjRetimeBwd( pRtm, pObj );
            // check if its fanouts should be retimed
            Rtm_ObjForEachFanin( pObj, pNext, k )
            {
                if ( pNext->fMark ) // skip aleady scheduled
                    continue;
                if ( pNext->nFanins == 0 ) // skip PIs
                    continue;
                if ( !Rtm_ObjCheckRetimeBwd( pNext ) ) // skip non-retimable
                    continue;
                Degree = Rtm_ObjGetDegreeBwd( pNext );
                DegreeMax = Abc_MaxInt( DegreeMax, Degree );
                if ( Degree > nStepsMax ) // skip nodes with high degree
                    continue;
                pNext->fMark = 1;
                pNext->Num = Degree;
                Vec_PtrPush( vQueue, pNext );
            }
        }
    }

    if ( fVerbose )
    {
        printf( "Performed %d %s latch moves of max depth %d and max latch count %d.\n", 
            Vec_PtrSize(vQueue), fForward? "fwd":"bwd", DegreeMax, Rtm_ManLatchMax(pRtm) );
        printf( "Memory usage = %d.  ", pRtm->nExtraCur );
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
    Vec_PtrFree( vQueue );

    // get the new manager
    pNew = Rtm_ManToAig( pRtm );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Rtm_ManFree( pRtm );
    // group the registers
clk = Abc_Clock();
    pNew = Aig_ManReduceLaches( pNew, fVerbose );
    if ( fVerbose )
    {
        ABC_PRT( "Register sharing time", Abc_Clock() - clk );
    }
    return pNew;
}